

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O0

int wally_ec_public_key_from_private_key
              (uchar *priv_key,size_t priv_key_len,uchar *bytes_out,size_t len)

{
  int iVar1;
  secp256k1_context *ctx_00;
  bool bVar2;
  _Bool ok;
  secp256k1_context *ctx;
  size_t len_in_out;
  secp256k1_pubkey pub;
  size_t len_local;
  uchar *bytes_out_local;
  size_t priv_key_len_local;
  uchar *priv_key_local;
  
  ctx = (secp256k1_context *)0x21;
  pub.data._56_8_ = len;
  ctx_00 = secp_ctx();
  if (ctx_00 == (secp256k1_context *)0x0) {
    priv_key_local._4_4_ = -3;
  }
  else {
    bVar2 = false;
    if ((((priv_key != (uchar *)0x0) && (bVar2 = false, priv_key_len == 0x20)) &&
        (bVar2 = false, bytes_out != (uchar *)0x0)) && (bVar2 = false, pub.data._56_8_ == 0x21)) {
      iVar1 = secp256k1_ec_pubkey_create(ctx_00,(secp256k1_pubkey *)&len_in_out,priv_key);
      bVar2 = false;
      if (iVar1 != 0) {
        iVar1 = pubkey_serialize(bytes_out,(size_t *)&ctx,(secp256k1_pubkey *)&len_in_out,0x102);
        bVar2 = false;
        if (iVar1 != 0) {
          bVar2 = ctx == (secp256k1_context *)0x21;
        }
      }
    }
    if ((!bVar2) && (bytes_out != (uchar *)0x0)) {
      wally_clear(bytes_out,pub.data._56_8_);
    }
    wally_clear(&len_in_out,0x40);
    priv_key_local._4_4_ = -2;
    if (bVar2) {
      priv_key_local._4_4_ = 0;
    }
  }
  return priv_key_local._4_4_;
}

Assistant:

int wally_ec_public_key_from_private_key(const unsigned char *priv_key, size_t priv_key_len,
                                         unsigned char *bytes_out, size_t len)
{
    secp256k1_pubkey pub;
    size_t len_in_out = EC_PUBLIC_KEY_LEN;
    const secp256k1_context *ctx = secp_ctx();
    bool ok;

    if (!ctx)
        return WALLY_ENOMEM;

    ok = priv_key && priv_key_len == EC_PRIVATE_KEY_LEN &&
         bytes_out && len == EC_PUBLIC_KEY_LEN &&
         pubkey_create(ctx, &pub, priv_key) &&
         pubkey_serialize(bytes_out, &len_in_out, &pub, PUBKEY_COMPRESSED) &&
         len_in_out == EC_PUBLIC_KEY_LEN;

    if (!ok && bytes_out)
        wally_clear(bytes_out, len);
    wally_clear(&pub, sizeof(pub));
    return ok ? WALLY_OK : WALLY_EINVAL;
}